

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_factorize_bump.c
# Opt level: O1

lu_int __thiscall lu_factorize_bump(void *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  lu_int lVar7;
  long lVar8;
  int *piVar9;
  
  iVar1 = *(int *)((long)this + 0x54);
  if (*(int *)((long)this + 0x194) + *(int *)((long)this + 0x13c) < iVar1) {
    lVar3 = *(long *)((long)this + 0x1d0);
    lVar4 = *(long *)((long)this + 0x1e0);
    lVar5 = *(long *)((long)this + 600);
    lVar6 = *(long *)((long)this + 0x268);
    do {
      if (*(int *)((long)this + 0x180) < 0) {
        lu_markowitz(this);
      }
      if (*(int *)((long)this + 0x17c) < 0) {
        iVar2 = *(int *)((long)this + 0x180);
        lVar8 = (long)iVar2;
        *(undefined4 *)(lVar3 + (long)*(int *)(lVar4 + lVar8 * 4) * 4) =
             *(undefined4 *)(lVar3 + lVar8 * 4);
        *(undefined4 *)(lVar4 + (long)*(int *)(lVar3 + lVar8 * 4) * 4) =
             *(undefined4 *)(lVar4 + lVar8 * 4);
        *(int *)(lVar3 + lVar8 * 4) = iVar2;
        *(int *)(lVar4 + lVar8 * 4) = iVar2;
        *(undefined4 *)((long)this + 0x180) = 0xffffffff;
        piVar9 = (int *)((long)this + 0x194);
      }
      else {
        lVar7 = lu_pivot(this);
        if (lVar7 != 0) {
          return lVar7;
        }
        *(undefined4 *)(lVar5 + (long)*(int *)((long)this + 0x17c) * 4) =
             *(undefined4 *)((long)this + 0x13c);
        *(undefined4 *)(lVar6 + (long)*(int *)((long)this + 0x180) * 4) =
             *(undefined4 *)((long)this + 0x13c);
        *(undefined8 *)((long)this + 0x17c) = 0xffffffffffffffff;
        piVar9 = (int *)((long)this + 0x13c);
      }
      *piVar9 = *piVar9 + 1;
    } while (*(int *)((long)this + 0x194) + *(int *)((long)this + 0x13c) < iVar1);
  }
  return 0;
}

Assistant:

lu_int lu_factorize_bump(struct lu *this)
{
    const lu_int m          = this->m;
    lu_int *colcount_flink  = this->colcount_flink;
    lu_int *colcount_blink  = this->colcount_blink;
    lu_int *pinv            = this->pinv;
    lu_int *qinv            = this->qinv;
    lu_int status = BASICLU_OK;

    while (this->rank + this->rankdef < m)
    {
        /*
         * Find pivot element. Markowitz search need not be called if the
         * previous call to lu_pivot() returned for reallocation. In this case
         * this->pivot_col is valid.
         */
        if (this->pivot_col < 0)
            lu_markowitz(this);
        assert(this->pivot_col >= 0);

        if (this->pivot_row < 0)
        {
            /* Eliminate empty column without choosing a pivot. */
            lu_list_remove(colcount_flink, colcount_blink, this->pivot_col);
            this->pivot_col = -1;
            this->rankdef++;
        }
        else
        {
            /* Eliminate pivot. This may require reallocation. */
            assert(pinv[this->pivot_row] == -1);
            assert(qinv[this->pivot_col] == -1);
            status = lu_pivot(this);
            if (status != BASICLU_OK)
                break;
            pinv[this->pivot_row] = this->rank;
            qinv[this->pivot_col] = this->rank;
            this->pivot_col = -1;
            this->pivot_row = -1;
            this->rank++;
        }
    }
    return status;
}